

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

Entry * __thiscall
Lib::DHMap<Kernel::Clause_*,_Lib::DArray<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
findEntry(DHMap<Kernel::Clause_*,_Lib::DArray<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          *this,Clause **key)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  Clause *pCVar4;
  type tVar5;
  Entry *pEVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  Entry *pEVar11;
  
  if (this->_capacity == 0) {
    pEVar11 = (Entry *)0x0;
  }
  else {
    tVar5 = DefaultHash::hash<Kernel::Clause>(*key);
    uVar1 = this->_capacity;
    uVar7 = (ulong)tVar5 % (ulong)uVar1;
    pEVar3 = this->_entries;
    uVar9 = pEVar3[uVar7].field_0._infoData;
    pEVar11 = (Entry *)0x0;
    if (uVar9 >> 2 == this->_timestamp) {
      pEVar6 = pEVar3 + uVar7;
      pCVar4 = *key;
      if (pEVar6->_key == pCVar4) {
        uVar9 = uVar9 & 1;
      }
      else {
        uVar10 = 0;
        if ((uVar9 & 2) == 0) {
          return (Entry *)0x0;
        }
        if (pCVar4 != (Clause *)0x0) {
          uVar10 = (ulong)(pCVar4->super_Unit)._number;
        }
        iVar8 = (int)(uVar10 % (ulong)uVar1);
        do {
          uVar7 = (ulong)((int)uVar7 + iVar8 + (uint)(iVar8 == 0)) % (ulong)uVar1;
          pEVar6 = pEVar3 + uVar7;
          uVar2 = pEVar3[uVar7].field_0._infoData;
          if (uVar2 >> 2 != uVar9 >> 2) break;
        } while (pEVar6->_key != pCVar4);
        uVar9 = uVar2 & 1 | (uVar2 ^ uVar9) >> 2;
      }
      pEVar11 = (Entry *)0x0;
      if (uVar9 == 0) {
        pEVar11 = pEVar6;
      }
    }
  }
  return pEVar11;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }